

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

idx_t __thiscall
duckdb::TaskScheduler::ExecuteTasks(TaskScheduler *this,atomic<bool> *marker,idx_t max_tasks)

{
  idx_t iVar1;
  bool bVar2;
  uint uVar3;
  pointer this_00;
  Task *pTVar4;
  InternalException *this_01;
  ulong uVar5;
  allocator local_71;
  idx_t local_70;
  shared_ptr<duckdb::Task,_true> task;
  string local_50;
  
  uVar5 = 0;
  while( true ) {
    if (((marker->_M_base)._M_i & 1U) == 0) {
      return uVar5;
    }
    if (max_tasks <= uVar5) break;
    task.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    task.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
              ::operator->(&this->queue);
    bVar2 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_dequeue<duckdb::shared_ptr<duckdb::Task,true>>
                      ((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                        *)this_00,&task);
    iVar1 = uVar5;
    if (bVar2) {
      pTVar4 = shared_ptr<duckdb::Task,_true>::operator->(&task);
      uVar3 = (*pTVar4->_vptr_Task[2])(pTVar4,0);
      iVar1 = local_70;
      switch(uVar3 & 0xff) {
      case 0:
      case 2:
        ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)&task);
        uVar5 = uVar5 + 1;
        iVar1 = local_70;
        break;
      case 1:
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   "Task should not return TASK_NOT_FINISHED in PROCESS_ALL mode",&local_71);
        InternalException::InternalException(this_01,&local_50);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case 3:
        pTVar4 = shared_ptr<duckdb::Task,_true>::operator->(&task);
        (*pTVar4->_vptr_Task[3])(pTVar4);
        ::std::__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2> *)&task);
        iVar1 = local_70;
      }
    }
    local_70 = iVar1;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &task.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar2) {
      return local_70;
    }
  }
  return uVar5;
}

Assistant:

idx_t TaskScheduler::ExecuteTasks(atomic<bool> *marker, idx_t max_tasks) {
#ifndef DUCKDB_NO_THREADS
	idx_t completed_tasks = 0;
	// loop until the marker is set to false
	while (*marker && completed_tasks < max_tasks) {
		shared_ptr<Task> task;
		if (!queue->q.try_dequeue(task)) {
			return completed_tasks;
		}
		auto execute_result = task->Execute(TaskExecutionMode::PROCESS_ALL);

		switch (execute_result) {
		case TaskExecutionResult::TASK_FINISHED:
		case TaskExecutionResult::TASK_ERROR:
			task.reset();
			completed_tasks++;
			break;
		case TaskExecutionResult::TASK_NOT_FINISHED:
			throw InternalException("Task should not return TASK_NOT_FINISHED in PROCESS_ALL mode");
		case TaskExecutionResult::TASK_BLOCKED:
			task->Deschedule();
			task.reset();
			break;
		}
	}
	return completed_tasks;
#else
	throw NotImplementedException("DuckDB was compiled without threads! Background thread loop is not allowed.");
#endif
}